

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::types_are_logically_equivalent(Compiler *this,SPIRType *a,SPIRType *b)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  size_t sVar5;
  uint *__s1;
  uint *__s2;
  TypedID *pTVar6;
  SPIRType *a_00;
  SPIRType *b_00;
  size_t local_40;
  size_t i;
  size_t member_types;
  size_t array_count;
  SPIRType *b_local;
  SPIRType *a_local;
  Compiler *this_local;
  
  if (*(int *)&(a->super_IVariant).field_0xc == *(int *)&(b->super_IVariant).field_0xc) {
    if (a->width == b->width) {
      if (a->vecsize == b->vecsize) {
        if (a->columns == b->columns) {
          sVar4 = VectorView<unsigned_int>::size(&(a->array).super_VectorView<unsigned_int>);
          sVar5 = VectorView<unsigned_int>::size(&(b->array).super_VectorView<unsigned_int>);
          if (sVar4 == sVar5) {
            sVar4 = VectorView<unsigned_int>::size(&(a->array).super_VectorView<unsigned_int>);
            if (sVar4 != 0) {
              __s1 = VectorView<unsigned_int>::data(&(a->array).super_VectorView<unsigned_int>);
              __s2 = VectorView<unsigned_int>::data(&(b->array).super_VectorView<unsigned_int>);
              iVar2 = memcmp(__s1,__s2,sVar4 << 2);
              if (iVar2 != 0) {
                return false;
              }
            }
            if (((*(int *)&(a->super_IVariant).field_0xc == 0x10) ||
                (*(int *)&(a->super_IVariant).field_0xc == 0x11)) &&
               ((a->image).type.id != (b->image).type.id)) {
              this_local._7_1_ = false;
            }
            else {
              sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                (&(a->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
              sVar5 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                (&(b->member_types).
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
              if (sVar4 == sVar5) {
                sVar4 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                                  (&(a->member_types).
                                    super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
                for (local_40 = 0; local_40 < sVar4; local_40 = local_40 + 1) {
                  pTVar6 = (TypedID *)
                           VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                     (&(a->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                      ,local_40);
                  uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar6);
                  a_00 = get<spirv_cross::SPIRType>(this,uVar3);
                  pTVar6 = (TypedID *)
                           VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                                     (&(b->member_types).
                                       super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>
                                      ,local_40);
                  uVar3 = TypedID::operator_cast_to_unsigned_int(pTVar6);
                  b_00 = get<spirv_cross::SPIRType>(this,uVar3);
                  bVar1 = types_are_logically_equivalent(this,a_00,b_00);
                  if (!bVar1) {
                    return false;
                  }
                }
                this_local._7_1_ = true;
              }
              else {
                this_local._7_1_ = false;
              }
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::types_are_logically_equivalent(const SPIRType &a, const SPIRType &b) const
{
	if (a.basetype != b.basetype)
		return false;
	if (a.width != b.width)
		return false;
	if (a.vecsize != b.vecsize)
		return false;
	if (a.columns != b.columns)
		return false;
	if (a.array.size() != b.array.size())
		return false;

	size_t array_count = a.array.size();
	if (array_count && memcmp(a.array.data(), b.array.data(), array_count * sizeof(uint32_t)) != 0)
		return false;

	if (a.basetype == SPIRType::Image || a.basetype == SPIRType::SampledImage)
	{
		if (memcmp(&a.image, &b.image, sizeof(SPIRType::Image)) != 0)
			return false;
	}

	if (a.member_types.size() != b.member_types.size())
		return false;

	size_t member_types = a.member_types.size();
	for (size_t i = 0; i < member_types; i++)
	{
		if (!types_are_logically_equivalent(get<SPIRType>(a.member_types[i]), get<SPIRType>(b.member_types[i])))
			return false;
	}

	return true;
}